

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

bool __thiscall
duckdb::UpdateSegment::HasUpdates(UpdateSegment *this,idx_t start_row_index,idx_t end_row_index)

{
  bool bVar1;
  StorageLockKey *pSVar2;
  idx_t i;
  ulong vector_idx;
  UndoBufferPointer UVar3;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> read_lock;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> local_30;
  
  pSVar2 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)&local_30);
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl == (UpdateNode *)0x0) {
    bVar1 = false;
  }
  else {
    vector_idx = start_row_index >> 0xb;
    do {
      bVar1 = vector_idx <= end_row_index >> 0xb;
      if (end_row_index >> 0xb < vector_idx) break;
      unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
      operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                 *)&local_30);
      UVar3 = GetUpdateNode(this,pSVar2,vector_idx);
      vector_idx = vector_idx + 1;
    } while (UVar3.entry == (UndoBufferEntry *)0x0);
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&local_30);
  return bVar1;
}

Assistant:

bool UpdateSegment::HasUpdates(idx_t start_row_index, idx_t end_row_index) {
	auto read_lock = lock.GetSharedLock();
	if (!root) {
		return false;
	}
	idx_t base_vector_index = start_row_index / STANDARD_VECTOR_SIZE;
	idx_t end_vector_index = end_row_index / STANDARD_VECTOR_SIZE;
	for (idx_t i = base_vector_index; i <= end_vector_index; i++) {
		auto entry = GetUpdateNode(*read_lock, i);
		if (entry.IsSet()) {
			return true;
		}
	}
	return false;
}